

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryControllersLoader15.cpp
# Opt level: O2

void __thiscall
COLLADASaxFWL::LibraryControllersLoader15::begin__skin(LibraryControllersLoader15 *this)

{
  skin__AttributeData *in_RSI;
  
  begin__skin((LibraryControllersLoader15 *)&this[-1].super_SourceArrayLoader15.mLoader,in_RSI);
  return;
}

Assistant:

bool LibraryControllersLoader15::begin__skin( const COLLADASaxFWL15::skin__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__skin(attributeData));
COLLADASaxFWL::skin__AttributeData attrData;
attrData.present_attributes = 0;
if ( (attributeData.present_attributes & COLLADASaxFWL15::skin__AttributeData::ATTRIBUTE_SOURCE_PRESENT) == COLLADASaxFWL15::skin__AttributeData::ATTRIBUTE_SOURCE_PRESENT ) {
    attrData.source = attributeData.source;
    attrData.present_attributes |= COLLADASaxFWL::skin__AttributeData::ATTRIBUTE_SOURCE_PRESENT;
}
return mLoader->begin__skin(attrData);
}